

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O0

bool __thiscall cmQtAutoGenerator::InfoT::LogError(InfoT *this,GenT genType,string_view message)

{
  GenT genType_00;
  Logger *this_00;
  string *this_01;
  char *pcVar1;
  undefined1 auVar2 [16];
  string_view text;
  string local_78;
  string local_58;
  string_view local_38;
  GenT local_24;
  InfoT *pIStack_20;
  GenT genType_local;
  InfoT *this_local;
  string_view message_local;
  
  message_local._M_len = (size_t)message._M_str;
  this_local = (InfoT *)message._M_len;
  local_24 = genType;
  pIStack_20 = this;
  this_00 = Log(this->Gen_);
  genType_00 = local_24;
  pcVar1 = (char *)(ulong)local_24;
  this_01 = InfoFile_abi_cxx11_(this->Gen_);
  auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_01);
  text._M_len = auVar2._8_8_;
  text._M_str = pcVar1;
  cmQtAutoGen::Quoted_abi_cxx11_(&local_78,auVar2._0_8_,text);
  cmStrCat<char_const(&)[25],std::__cxx11::string,char_const(&)[3],std::basic_string_view<char,std::char_traits<char>>&>
            (&local_58,(char (*) [25])"Info error in info file\n",&local_78,(char (*) [3])0xffee43,
             (basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  local_38 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_58);
  Logger::Error(this_00,genType_00,local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return false;
}

Assistant:

bool cmQtAutoGenerator::InfoT::LogError(GenT genType,
                                        cm::string_view message) const
{
  this->Gen_.Log().Error(genType,
                         cmStrCat("Info error in info file\n",
                                  Quoted(this->Gen_.InfoFile()), ":\n",
                                  message));
  return false;
}